

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypePrinter.cpp
# Opt level: O1

void __thiscall slang::ast::TypeArgFormatter::TypeArgFormatter(TypeArgFormatter *this)

{
  FormatBuffer *__s;
  value_type_pointer ppTVar1;
  size_t sVar2;
  
  (this->super_DiagArgFormatter)._vptr_DiagArgFormatter =
       (_func_int **)&PTR__TypeArgFormatter_006b5f40;
  (this->printer).options.anonymousTypeStyle = SystemName;
  (this->printer).options.addSingleQuotes = false;
  (this->printer).options.elideScopeNames = false;
  (this->printer).options.printAKA = false;
  (this->printer).options.skipScopedTypeNames = false;
  (this->printer).options.skipTypeDefs = false;
  (this->printer).options.fullEnumType = false;
  __s = (FormatBuffer *)operator_new(0x220);
  memset(__s,0,0x220);
  *(code **)((long)&(__s->buf).super_buffer<char> + 0x18) =
       ::fmt::v11::basic_memory_buffer<char,_500UL,_fmt::v11::detail::allocator<char>_>::grow;
  (__s->buf).super_buffer<char>.ptr_ = (__s->buf).store_;
  *(size_t *)((long)&(__s->buf).super_buffer<char> + 0x10) = 500;
  __s->showColors = false;
  (this->printer).buffer._M_t.
  super___uniq_ptr_impl<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_>._M_t.
  super__Tuple_impl<0UL,_slang::FormatBuffer_*,_std::default_delete<slang::FormatBuffer>_>.
  super__Head_base<0UL,_slang::FormatBuffer_*,_false>._M_head_impl = __s;
  (this->seenTypes).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_slang::ast::Type_*>,_slang::hash<const_slang::ast::Type_*>,_std::equal_to<const_slang::ast::Type_*>,_std::allocator<const_slang::ast::Type_*>_>
  .arrays.groups_size_index = 0x3f;
  (this->seenTypes).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_slang::ast::Type_*>,_slang::hash<const_slang::ast::Type_*>,_std::equal_to<const_slang::ast::Type_*>,_std::allocator<const_slang::ast::Type_*>_>
  .arrays.groups_size_mask = 1;
  (this->seenTypes).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_slang::ast::Type_*>,_slang::hash<const_slang::ast::Type_*>,_std::equal_to<const_slang::ast::Type_*>,_std::allocator<const_slang::ast::Type_*>_>
  .arrays.groups_ = (group_type_pointer)0x0;
  (this->seenTypes).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_slang::ast::Type_*>,_slang::hash<const_slang::ast::Type_*>,_std::equal_to<const_slang::ast::Type_*>,_std::allocator<const_slang::ast::Type_*>_>
  .arrays.elements_ = (value_type_pointer)0x0;
  (this->seenTypes).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_slang::ast::Type_*>,_slang::hash<const_slang::ast::Type_*>,_std::equal_to<const_slang::ast::Type_*>,_std::allocator<const_slang::ast::Type_*>_>
  .arrays.groups_ =
       (group_type_pointer)
       &boost::unordered::detail::foa::
        dummy_groups<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,2ul>()
        ::storage;
  ppTVar1 = (this->seenTypes).table_.
            super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_slang::ast::Type_*>,_slang::hash<const_slang::ast::Type_*>,_std::equal_to<const_slang::ast::Type_*>,_std::allocator<const_slang::ast::Type_*>_>
            .arrays.elements_;
  sVar2 = 0x1d;
  if (ppTVar1 != (value_type_pointer)0x0) {
    ppTVar1 = (value_type_pointer)0x1d;
  }
  (this->seenTypes).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_slang::ast::Type_*>,_slang::hash<const_slang::ast::Type_*>,_std::equal_to<const_slang::ast::Type_*>,_std::allocator<const_slang::ast::Type_*>_>
  .size_ctrl.ml = (size_t)ppTVar1;
  (this->seenTypes).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_slang::ast::Type_*>,_slang::hash<const_slang::ast::Type_*>,_std::equal_to<const_slang::ast::Type_*>,_std::allocator<const_slang::ast::Type_*>_>
  .size_ctrl.size = 0;
  (this->typesToDisambiguate).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_slang::ast::Type_*>,_slang::hash<const_slang::ast::Type_*>,_std::equal_to<const_slang::ast::Type_*>,_std::allocator<const_slang::ast::Type_*>_>
  .arrays.groups_size_index = 0x3f;
  (this->typesToDisambiguate).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_slang::ast::Type_*>,_slang::hash<const_slang::ast::Type_*>,_std::equal_to<const_slang::ast::Type_*>,_std::allocator<const_slang::ast::Type_*>_>
  .arrays.groups_size_mask = 1;
  (this->typesToDisambiguate).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_slang::ast::Type_*>,_slang::hash<const_slang::ast::Type_*>,_std::equal_to<const_slang::ast::Type_*>,_std::allocator<const_slang::ast::Type_*>_>
  .arrays.groups_ = (group_type_pointer)0x0;
  (this->typesToDisambiguate).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_slang::ast::Type_*>,_slang::hash<const_slang::ast::Type_*>,_std::equal_to<const_slang::ast::Type_*>,_std::allocator<const_slang::ast::Type_*>_>
  .arrays.elements_ = (value_type_pointer)0x0;
  (this->typesToDisambiguate).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_slang::ast::Type_*>,_slang::hash<const_slang::ast::Type_*>,_std::equal_to<const_slang::ast::Type_*>,_std::allocator<const_slang::ast::Type_*>_>
  .arrays.groups_ =
       (group_type_pointer)
       &boost::unordered::detail::foa::
        dummy_groups<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,2ul>()
        ::storage;
  if ((this->typesToDisambiguate).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_slang::ast::Type_*>,_slang::hash<const_slang::ast::Type_*>,_std::equal_to<const_slang::ast::Type_*>,_std::allocator<const_slang::ast::Type_*>_>
      .arrays.elements_ == (value_type_pointer)0x0) {
    sVar2 = 0;
  }
  (this->typesToDisambiguate).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_slang::ast::Type_*>,_slang::hash<const_slang::ast::Type_*>,_std::equal_to<const_slang::ast::Type_*>,_std::allocator<const_slang::ast::Type_*>_>
  .size_ctrl.ml = sVar2;
  (this->typesToDisambiguate).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_slang::ast::Type_*>,_slang::hash<const_slang::ast::Type_*>,_std::equal_to<const_slang::ast::Type_*>,_std::allocator<const_slang::ast::Type_*>_>
  .size_ctrl.size = 0;
  (this->printer).options.addSingleQuotes = true;
  (this->printer).options.elideScopeNames = true;
  (this->printer).options.printAKA = true;
  (this->printer).options.anonymousTypeStyle = FriendlyName;
  return;
}

Assistant:

TypeArgFormatter::TypeArgFormatter() {
    printer.options.addSingleQuotes = true;
    printer.options.elideScopeNames = true;
    printer.options.printAKA = true;
    printer.options.anonymousTypeStyle = TypePrintingOptions::FriendlyName;
}